

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O3

bool __thiscall
Refal2::CSetBuilder<unsigned_int>::Export
          (CSetBuilder<unsigned_int> *this,CFastSet<unsigned_int> *exportTo)

{
  TStatus TVar1;
  CSetBuilder<unsigned_int> *set;
  
  TVar1 = this->fullSetStatus;
  if ((TVar1 != S_Thru) && ((this->thru)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    set = (CSetBuilder<unsigned_int> *)&this->no;
    if (TVar1 != S_Yes) {
      set = this;
    }
    CFastSet<unsigned_int>::operator=(exportTo,&set->yes);
    return TVar1 == S_Yes;
  }
  __assert_fail("fullSetStatus != S_Thru && thru.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/SetBuilder.h"
                ,0x38,
                "bool Refal2::CSetBuilder<unsigned int>::Export(CFastSet<T> &) [T = unsigned int]");
}

Assistant:

bool CSetBuilder<T>::Export( CFastSet<T>& exportTo )
{
	assert( fullSetStatus != S_Thru && thru.empty() );
	if( fullSetStatus == S_Yes ) {
		exportTo = no;
		return true;
	} else {
		exportTo = yes;
		return false;
	}
}